

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O2

void close_unix_descriptors(void)

{
  int iVar1;
  char *pcVar2;
  int slot;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  lVar3 = 0;
  do {
    if (NPROCS <= lVar3) {
      wait_for_comm_processes();
      return;
    }
    switch(*(undefined4 *)((long)&UJ->type + lVar4)) {
    case 0xfffffffc:
      goto switchD_0012f6c1_caseD_fffffffc;
    case 0xfffffffd:
      close((int)lVar3);
      pcVar2 = *(char **)((long)&UJ->pathname + lVar4);
      if (pcVar2 != (char *)0x0) {
        unlink(pcVar2);
        free(*(void **)((long)&UJ->pathname + lVar4));
        *(undefined8 *)((long)&UJ->pathname + lVar4) = 0;
      }
      break;
    case 0xfffffffe:
      iVar1 = kill(*(__pid_t *)((long)&UJ->PID + lVar4),9);
      if (iVar1 < 0) {
        pcVar2 = "Killing process";
LAB_0012f754:
        perror(pcVar2);
      }
      goto LAB_0012f723;
    case 0xffffffff:
      iVar1 = kill(*(__pid_t *)((long)&UJ->PID + lVar4),9);
      if (iVar1 < 0) {
        pcVar2 = "Killing shell";
        goto LAB_0012f754;
      }
LAB_0012f723:
      *(undefined4 *)((long)&UJ->PID + lVar4) = 0;
switchD_0012f6c1_caseD_fffffffc:
      close((int)lVar3);
    }
    *(undefined4 *)((long)&UJ->type + lVar4) = 0;
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x18;
  } while( true );
}

Assistant:

void close_unix_descriptors(void) /* Get ready to shut Maiko down */
{
  for (int slot = 0; slot < NPROCS; slot++) {
    /* If this slot has an active job */
    switch (UJ[slot].type) {
      case UJUNUSED:
        break;
      case UJSHELL:
        if (kill(UJ[slot].PID, SIGKILL) < 0) perror("Killing shell");
        UJ[slot].PID = 0;
        DBPRINT(("Kill 5 closing shell desc %d.\n", slot));
        close(slot);
        break;

      case UJPROCESS:
        if (kill(UJ[slot].PID, SIGKILL) < 0) perror("Killing process");
        UJ[slot].PID = 0;
        DBPRINT(("Kill 5 closing process desc %d.\n", slot));
        close(slot);
        break;

      case UJSOCKET:
        close(slot);
        if (UJ[slot].pathname != NULL) {
          /* socket created directly from Lisp; pathname is in .pathname */
          DBPRINT(("Closing socket %d bound to %s\n", slot, UJ[slot].pathname));
          unlink(UJ[slot].pathname);
          free(UJ[slot].pathname);
          UJ[slot].pathname = NULL;
        }
        break;

      case UJSOSTREAM: close(slot); break;
    }
    UJ[slot].type = UJUNUSED;
  }

  /* make sure everyone's really dead before proceeding */
  wait_for_comm_processes();
}